

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  char *pcVar1;
  FILE *__s;
  size_t __n;
  size_t sVar2;
  long *plVar3;
  EXRHeader *pEVar4;
  uchar *mem;
  allocator local_69;
  EXRHeader *local_68;
  long local_60;
  undefined1 local_58 [16];
  EXRHeader *local_48 [2];
  
  if ((filename == (char *)0x0 || exr_image == (EXRImage *)0x0) ||
     (exr_header->compression_type < 0)) {
    local_68 = (EXRHeader *)local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid argument for SaveEXRImageToFile","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    if (local_68 != (EXRHeader *)local_58) {
      operator_delete(local_68);
    }
    return -3;
  }
  if (exr_header->compression_type == 0x80) {
    local_68 = (EXRHeader *)local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"ZFP compression is not supported in this build","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    if (local_68 != (EXRHeader *)local_58) {
      operator_delete(local_68);
    }
    return -10;
  }
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    std::__cxx11::string::string((string *)local_48,filename,&local_69);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x25a3b2);
    pEVar4 = (EXRHeader *)(plVar3 + 2);
    if ((EXRHeader *)*plVar3 == pEVar4) {
      local_58._0_4_ = pEVar4->pixel_aspect_ratio;
      local_58._4_4_ = pEVar4->line_order;
      local_58._8_8_ = plVar3[3];
      local_68 = (EXRHeader *)local_58;
    }
    else {
      local_58._0_4_ = pEVar4->pixel_aspect_ratio;
      local_58._4_4_ = pEVar4->line_order;
      local_68 = (EXRHeader *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)pEVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    if (local_68 != (EXRHeader *)local_58) {
      operator_delete(local_68);
    }
    pEVar4 = local_48[0];
    if (local_48[0] == (EXRHeader *)&stack0xffffffffffffffc8) {
      return -0xb;
    }
  }
  else {
    local_48[0] = (EXRHeader *)0x0;
    local_68 = exr_header;
    __n = tinyexr::SaveEXRNPartImageToMemory(exr_image,&local_68,1,(uchar **)local_48,err);
    if (__n == 0) {
      return -0xc;
    }
    if (local_48[0] == (EXRHeader *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = fwrite(local_48[0],1,__n,__s);
    }
    free(local_48[0]);
    fclose(__s);
    if (sVar2 == __n) {
      return 0;
    }
    local_68 = (EXRHeader *)local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Cannot write a file","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    pEVar4 = local_68;
    if (local_68 == (EXRHeader *)local_58) {
      return -0xb;
    }
  }
  operator_delete(pEVar4);
  return -0xb;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}